

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O1

void __thiscall NaNNRegrPlantLearn::~NaNNRegrPlantLearn(NaNNRegrPlantLearn *this)

{
  this->_vptr_NaNNRegrPlantLearn = (_func_int **)&PTR__NaNNRegrPlantLearn_00107c58;
  *(code **)&this->skip_yt = NaPNBus2i1o::NaPNBus2i1o;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1938);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x18b8);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x1870);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->skip_yt);
  *(code **)&this->skip_u = NaPNBus2i1o::NaPNBus2i1o;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x17a0);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1720);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x16d8);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->skip_u);
  *(code **)&this->skip_y = NaPNBus2i1o::NaPNBus2i1o;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1608);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1588);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x1540);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->skip_y);
  *(code **)&this->delay_yt = NaPetriNet::step_alive;
  NaVector::~NaVector((NaVector *)&this->field_0x14d0);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1438);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x13b8);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x1370);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->delay_yt);
  *(code **)&this->delay_u = NaPetriNet::step_alive;
  NaVector::~NaVector((NaVector *)&this->field_0x1300);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1268);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x11e8);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x11a0);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->delay_u);
  *(code **)&this->delay_y = NaPetriNet::step_alive;
  NaVector::~NaVector((NaVector *)&this->field_0x1130);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1098);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x1018);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0xfd0);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->delay_y);
  *(code **)&this->statan_y = NaPrintLog;
  NaVector::~NaVector((NaVector *)&this->field_0xec8);
  NaVector::~NaVector((NaVector *)&this->field_0xeb0);
  NaVector::~NaVector((NaVector *)&this->field_0xe88);
  NaVector::~NaVector((NaVector *)&this->field_0xe70);
  NaVector::~NaVector((NaVector *)&this->field_0xe58);
  NaVector::~NaVector((NaVector *)&this->field_0xe40);
  NaVector::~NaVector((NaVector *)&this->field_0xe28);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0xda8);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0xd60);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->statan_y);
  *(code **)&this->statan = NaPrintLog;
  NaVector::~NaVector((NaVector *)&this->field_0xc58);
  NaVector::~NaVector((NaVector *)&this->field_0xc40);
  NaVector::~NaVector((NaVector *)&this->field_0xc18);
  NaVector::~NaVector((NaVector *)&this->field_0xc00);
  NaVector::~NaVector((NaVector *)&this->field_0xbe8);
  NaVector::~NaVector((NaVector *)&this->field_0xbd0);
  NaVector::~NaVector((NaVector *)&this->field_0xbb8);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0xb38);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0xaf0);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->statan);
  *(code **)&this->errcomp = NaPetriNode::is_verbose;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0xa28);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x9e0);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x998);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->errcomp);
  *(code **)&this->bus = NaPNDelay::add_delay;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x8d0);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x888);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x840);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->bus);
  NaPNTeacher::~NaPNTeacher(&this->nnteacher);
  *(code **)&this->nnplant = NaNNUnit::~NaNNUnit;
  *(undefined ***)&this->field_0x5e0 = &PTR__NaDynAr_00107ca8;
  NaDynAr<NaNNUnit>::clean((NaDynAr<NaNNUnit> *)&this->field_0x5e0);
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x548);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x500);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->nnplant);
  NaPNFileOutput::~NaPNFileOutput(&this->nn_y);
  NaPNFileOutput::~NaPNFileOutput(&this->tr_y);
  *(code **)&this->fetch_y = NaNNUnit::Load;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)&this->field_0x2e0);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)&this->field_0x298);
  NaPetriNode::~NaPetriNode((NaPetriNode *)&this->fetch_y);
  NaPNFileInput::~NaPNFileInput(&this->in_u);
  NaPNFileInput::~NaPNFileInput(&this->in_y);
  NaPetriNet::~NaPetriNet(&this->net);
  return;
}

Assistant:

NaNNRegrPlantLearn::~NaNNRegrPlantLearn ()
{
    // Nothing to do
}